

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::DeleteLogDestinations(void)

{
  LogFileObject *this;
  _Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_> *p_Var1;
  int severity;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    this = (LogFileObject *)(&log_destinations_)[lVar2];
    if (this != (LogFileObject *)0x0) {
      anon_unknown_10::LogFileObject::~LogFileObject(this);
    }
    operator_delete(this,0xe0);
    (&log_destinations_)[lVar2] = 0;
  }
  ::glog_internal_namespace_::Mutex::Lock((Mutex *)sink_mutex_);
  p_Var1 = sinks_;
  if (sinks_ != (_Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0) {
    std::_Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_>::~_Vector_base(sinks_);
  }
  operator_delete(p_Var1,0x18);
  sinks_ = (_Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0;
  ::glog_internal_namespace_::Mutex::Unlock((Mutex *)sink_mutex_);
  return;
}

Assistant:

void LogDestination::DeleteLogDestinations() {
  for (int severity = 0; severity < NUM_SEVERITIES; ++severity) {
    delete log_destinations_[severity];
    log_destinations_[severity] = NULL;
  }
  MutexLock l(&sink_mutex_);
  delete sinks_;
  sinks_ = NULL;
}